

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

Rfn_Obj_t * Gla_ObjRef(Gla_Man_t *p,Gia_Obj_t *pObj,int f)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  Rfn_Obj_t *pRVar3;
  int Fill;
  
  pVVar1 = p->pvRefis;
  iVar2 = Gia_ObjId(p->pGia,pObj);
  Vec_IntFillExtra(pVVar1 + iVar2,f + 1,Fill);
  pRVar3 = (Rfn_Obj_t *)Vec_IntEntryP(pVVar1 + iVar2,f);
  return pRVar3;
}

Assistant:

static inline Rfn_Obj_t * Gla_ObjRef( Gla_Man_t * p, Gia_Obj_t * pObj, int f ) { return (Rfn_Obj_t *)Vec_IntGetEntryP( &(p->pvRefis[Gia_ObjId(p->pGia, pObj)]), f ); }